

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe2_LPGCachePolicy.cpp
# Opt level: O2

GMM_STATUS __thiscall GmmLib::GmmXe2_LPGCachePolicy::SetupPAT(GmmXe2_LPGCachePolicy *this)

{
  Context *pCVar1;
  uint32_t i;
  ulong uVar2;
  
  pCVar1 = *(Context **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 8);
  for (uVar2 = 0;
      uVar2 < *(uint32_t *)
               ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                       super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                       super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x10);
      uVar2 = uVar2 + 1) {
    pCVar1->PrivatePATTable[uVar2].Value = 0x3f;
  }
  pCVar1->PrivatePATTable[0] = (GMM_PRIVATE_PAT)0xc;
  pCVar1->PrivatePATTable[1] = (GMM_PRIVATE_PAT)0xe;
  pCVar1->PrivatePATTable[2] = (GMM_PRIVATE_PAT)0xf;
  pCVar1->PrivatePATTable[3] = (GMM_PRIVATE_PAT)0x3c;
  pCVar1->PrivatePATTable[4] = (GMM_PRIVATE_PAT)0x32;
  pCVar1->PrivatePATTable[5] = (GMM_PRIVATE_PAT)0x3e;
  pCVar1->PrivatePATTable[6].Value = pCVar1->PrivatePATTable[6].Value & 0x6f0 | 0xc;
  pCVar1->PrivatePATTable[6].Value =
       (uint)((*(Context **)
                ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                        super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy
                        .super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 8))->SkuTable).
             field_0 >> 4 & 0x10 | 0x40c;
  pCVar1->PrivatePATTable[7] = (GMM_PRIVATE_PAT)0x33;
  pCVar1->PrivatePATTable[8] = (GMM_PRIVATE_PAT)0x30;
  pCVar1->PrivatePATTable[9] = (GMM_PRIVATE_PAT)0x20c;
  pCVar1->PrivatePATTable[10] = (GMM_PRIVATE_PAT)0x230;
  pCVar1->PrivatePATTable[0xb].Value = pCVar1->PrivatePATTable[0xb].Value & 0x6f0 | 0xc;
  pCVar1->PrivatePATTable[0xb].Value =
       (uint)((*(Context **)
                ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                        super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy
                        .super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 8))->SkuTable).
             field_0 >> 4 & 0x10 | 0x60c;
  pCVar1->PrivatePATTable[0xc] = (GMM_PRIVATE_PAT)0x23c;
  pCVar1->PrivatePATTable[0xd] = (GMM_PRIVATE_PAT)0x0;
  pCVar1->PrivatePATTable[0xe].Value = 0x200;
  pCVar1->PrivatePATTable[0xf].Value = pCVar1->PrivatePATTable[0xf].Value & 0x6f0 | 4;
  pCVar1->PrivatePATTable[0xf].Value =
       (uint)((*(Context **)
                ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                        super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy
                        .super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 8))->SkuTable).
             field_0 >> 4 & 0x10 | 0x604;
  pCVar1->PrivatePATTable[0x14] = (GMM_PRIVATE_PAT)0x4c;
  pCVar1->PrivatePATTable[0x15] = (GMM_PRIVATE_PAT)0x24c;
  pCVar1->PrivatePATTable[0x16] = (GMM_PRIVATE_PAT)0x4e;
  pCVar1->PrivatePATTable[0x17] = (GMM_PRIVATE_PAT)0x4f;
  pCVar1->PrivatePATTable[0x18] = (GMM_PRIVATE_PAT)0x8c;
  pCVar1->PrivatePATTable[0x19] = (GMM_PRIVATE_PAT)0x28c;
  pCVar1->PrivatePATTable[0x1a] = (GMM_PRIVATE_PAT)0x8e;
  pCVar1->PrivatePATTable[0x1b] = (GMM_PRIVATE_PAT)0x8f;
  pCVar1->PrivatePATTable[0x1c] = (GMM_PRIVATE_PAT)0xcc;
  pCVar1->PrivatePATTable[0x1d] = (GMM_PRIVATE_PAT)0x2cc;
  pCVar1->PrivatePATTable[0x1e] = (GMM_PRIVATE_PAT)0xce;
  pCVar1->PrivatePATTable[0x1f] = (GMM_PRIVATE_PAT)0xcf;
  *(undefined4 *)
   &(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
    field_0x2c = 0x1f;
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmXe2_LPGCachePolicy::SetupPAT()
{
    GMM_PRIVATE_PAT *pPATTlbElement = &(pGmmLibContext->GetPrivatePATTable()[0]);

#define L4_WB (0x0)
#define L4_WT (0x1)
#define L4_UC (0x3)

#define L3_WB (0x0)
#define L3_XD (pGmmLibContext->GetSkuTable().FtrL3TransientDataFlush ? 0x1 : 0x0)
#define L3_UC (0x3)
#define L3_XA (0x2) // WB Transient App

#define GMM_DEFINE_PAT_ELEMENT(indx, Coh, L4Caching, L3Caching, L3ClassOfService, CompressionEn, NoCachePromote) \
    {                                                                                                            \
        pPATTlbElement[indx].Xe2.Coherency             = Coh;                                                    \
        pPATTlbElement[indx].Xe2.L4CC                  = L4Caching;                                              \
        pPATTlbElement[indx].Xe2.Reserved1             = 0;                                                      \
        pPATTlbElement[indx].Xe2.Reserved2             = 0;                                                      \
        pPATTlbElement[indx].Xe2.L3CC                  = L3Caching;                                              \
        pPATTlbElement[indx].Xe2.L3CLOS                = L3ClassOfService;                                       \
        pPATTlbElement[indx].Xe2.LosslessCompressionEn = CompressionEn;                                          \
        pPATTlbElement[indx].Xe2.NoCachingPromote      = NoCachePromote;                                         \
    }

    // clang-format off

    // Default PAT Table
    // 32 nos
    for (uint32_t i = 0; i < (NumPATRegisters); i++)
    {   //                      Index  Coherency  CachingPolicy  L3Caching  L3ClassOfService  CompressionEn  NoCachingPromote
        GMM_DEFINE_PAT_ELEMENT( i,     3,         L4_UC,         L3_UC,     0,                0,             0);
    }

    // Fixed PAT Table
    //                      Index  Coherency  L4 CachingPolicy   L3 CachingPolicy   L3 CLOS      CompressionEn   NoCachingPromote
    //Group: GGT/PPGTT[4]
    GMM_DEFINE_PAT_ELEMENT( 0      , 0      , L4_UC              , L3_WB           , 0          , 0             , 0)    //          | L3_WB 
    GMM_DEFINE_PAT_ELEMENT( 1      , 2      , L4_UC              , L3_WB           , 0          , 0             , 0)    //          | L3_WB | 1 way coherent
    GMM_DEFINE_PAT_ELEMENT( 2      , 3      , L4_UC              , L3_WB           , 0          , 0             , 0)    //          | L3_WB | 2 way coherent
    GMM_DEFINE_PAT_ELEMENT( 3      , 0      , L4_UC              , L3_UC           , 0          , 0             , 0)    // **UC   
    //Group: 1 way Coh
    GMM_DEFINE_PAT_ELEMENT( 4      , 2      , L4_WB              , L3_UC           , 0          , 0             , 0)    // L4_WB            | 1 way coherent
    GMM_DEFINE_PAT_ELEMENT( 5      , 2      , L4_UC              , L3_UC           , 0          , 0             , 0)    // **UC             | 1 way coherent
    //Group: Compression Disabled
    GMM_DEFINE_PAT_ELEMENT( 6      , 0      , L4_UC              , L3_XD           , 0          , 0             , 1)    //          | L3_XD 
    GMM_DEFINE_PAT_ELEMENT( 7      , 3      , L4_WB              , L3_UC           , 0          , 0             , 0)    // L4_WB            | 2 way coherent
    GMM_DEFINE_PAT_ELEMENT( 8      , 0      , L4_WB              , L3_UC           , 0          , 0             , 0)    // L4_WB  
    //Group: Compression Enabled
    GMM_DEFINE_PAT_ELEMENT( 9      , 0      , L4_UC              , L3_WB           , 0          , 1             , 0)    //          | L3_WB | Comp 
    GMM_DEFINE_PAT_ELEMENT( 10     , 0      , L4_WB              , L3_UC           , 0          , 1             , 0)    // L4_WB            | Comp
    GMM_DEFINE_PAT_ELEMENT( 11     , 0      , L4_UC              , L3_XD           , 0          , 1             , 1)    //          | L3_XD | Comp 
    GMM_DEFINE_PAT_ELEMENT( 12     , 0      , L4_UC              , L3_UC           , 0          , 1             , 0)    // **UC             | Comp 

    GMM_DEFINE_PAT_ELEMENT( 13     , 0      , L4_WB              , L3_WB           , 0          , 0             , 0)     // L4_WB    | L3_WB 
    GMM_DEFINE_PAT_ELEMENT( 14     , 0      , L4_WB              , L3_WB           , 0          , 1             , 0)    // L4_WB    | L3_WB | Comp
    GMM_DEFINE_PAT_ELEMENT( 15     , 0      , L4_WT              , L3_XD           , 0          , 1             , 1)    // L4_WT    | L3_XD | Comp 
    
    //Reserved 16-19
    //Group: CLOS1
    GMM_DEFINE_PAT_ELEMENT( 20      , 0      , L4_UC             , L3_WB           , 1          , 0             , 0)    //          | L3_WB   
    GMM_DEFINE_PAT_ELEMENT( 21      , 0      , L4_UC             , L3_WB           , 1          , 1             , 0)    //          | L3_WB | Comp 
    GMM_DEFINE_PAT_ELEMENT( 22      , 2      , L4_UC             , L3_WB           , 1          , 0             , 0)    //          | L3_WB | 1 way coherent
    GMM_DEFINE_PAT_ELEMENT( 23      , 3      , L4_UC             , L3_WB           , 1          , 0             , 0)    //          | L3_WB | 2 way coherent 
    //Group:CLOS2=>Clone of CLOS1
    GMM_DEFINE_PAT_ELEMENT( 24      , 0      , L4_UC             , L3_WB           , 2          , 0             , 0)    //          | L3_WB   
    GMM_DEFINE_PAT_ELEMENT( 25      , 0      , L4_UC             , L3_WB           , 2          , 1             , 0)    //          | L3_WB | Comp 
    GMM_DEFINE_PAT_ELEMENT( 26      , 2      , L4_UC             , L3_WB           , 2          , 0             , 0)    //          | L3_WB | 1 way coherent
    GMM_DEFINE_PAT_ELEMENT( 27      , 3      , L4_UC             , L3_WB           , 2          , 0             , 0)    //          | L3_WB | 2 way coherent 
    //Group:CLOS3=>Clone of CLOS1
    GMM_DEFINE_PAT_ELEMENT( 28      , 0      , L4_UC             , L3_WB           , 3          , 0             , 0)    //          | L3_WB    
    GMM_DEFINE_PAT_ELEMENT( 29      , 0      , L4_UC             , L3_WB           , 3          , 1             , 0)    //          | L3_WB | Comp 
    GMM_DEFINE_PAT_ELEMENT( 30      , 2      , L4_UC             , L3_WB           , 3          , 0             , 0)    //          | L3_WB | 1 way coherent
    GMM_DEFINE_PAT_ELEMENT( 31      , 3      , L4_UC             , L3_WB           , 3          , 0             , 0)    //          | L3_WB | 2 way coherent 

    CurrentMaxPATIndex = 31;

// clang-format on
#undef GMM_DEFINE_PAT
#undef L4_WB
#undef L4_WT
#undef L4_UC

#undef L3_WB
#undef L3_XD
#undef L3_UC
    return GMM_SUCCESS;
}